

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

wchar_t number_charging(object *obj)

{
  uint uVar1;
  wchar_t wVar2;
  
  uVar1 = randcalc(obj->time,0,AVERAGE);
  if (((int)uVar1 < 1) || (obj->timeout < 1)) {
    wVar2 = L'\0';
  }
  else {
    wVar2 = (((int)obj->timeout + uVar1) - 1) / uVar1;
    if ((uint)obj->number <= (uint)wVar2) {
      wVar2 = (uint)obj->number;
    }
  }
  return wVar2;
}

Assistant:

int number_charging(const struct object *obj)
{
	int charge_time, num_charging;

	charge_time = randcalc(obj->time, 0, AVERAGE);

	/* Item has no timeout */
	if (charge_time <= 0) return 0;

	/* No items are charging */
	if (obj->timeout <= 0) return 0;

	/* Calculate number charging based on timeout */
	num_charging = (obj->timeout + charge_time - 1) / charge_time;

	/* Number charging cannot exceed stack size */
	if (num_charging > obj->number) num_charging = obj->number;

	return num_charging;
}